

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_nextInstance
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar2 = *(long *)(uVar1 - 0x10) + 0x10;
    if (*(long *)(uVar1 - 0x10) == 0) {
      sVar2 = 0;
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_nextInstance(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t object = arguments[0];
    if(!sysbvm_tuple_isNonNullPointer(object))
        return SYSBVM_NULL_TUPLE;

    sysbvm_heap_mallocObjectHeader_t *objectPreheader = (sysbvm_heap_mallocObjectHeader_t*)object - 1;
    sysbvm_heap_mallocObjectHeader_t *nextObject = objectPreheader->next;
    if(!nextObject)
        return SYSBVM_NULL_TUPLE;

    return (sysbvm_tuple_t)(nextObject + 1);
}